

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O1

void __thiscall duckdb::DataChunk::Fuse(DataChunk *this,DataChunk *other)

{
  long lVar1;
  reference __args;
  reference __args_00;
  size_type __n;
  
  lVar1 = (long)(other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar1 != 0) {
    lVar1 = (lVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
    __n = 0;
    do {
      __args = vector<duckdb::Vector,_true>::operator[](&other->data,__n);
      ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::emplace_back<duckdb::Vector>
                ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)this,__args);
      __args_00 = vector<duckdb::VectorCache,_true>::operator[](&other->vector_caches,__n);
      ::std::vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>::
      emplace_back<duckdb::VectorCache>
                (&(this->vector_caches).
                  super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>,__args_00)
      ;
      __n = __n + 1;
    } while (lVar1 + (ulong)(lVar1 == 0) != __n);
  }
  ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::_M_erase_at_end
            ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)other,
             (other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start);
  ::std::vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>::clear
            (&(other->vector_caches).
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>);
  other->count = 0;
  other->capacity = 0;
  return;
}

Assistant:

void DataChunk::Fuse(DataChunk &other) {
	D_ASSERT(other.size() == size());
	const idx_t num_cols = other.data.size();
	for (idx_t col_idx = 0; col_idx < num_cols; ++col_idx) {
		data.emplace_back(std::move(other.data[col_idx]));
		vector_caches.emplace_back(std::move(other.vector_caches[col_idx]));
	}
	other.Destroy();
}